

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::ktx_texture::write_to_stream
          (ktx_texture *this,data_stream_serializer *serializer,bool no_keyvalue_data)

{
  ushort *puVar1;
  uint32 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  vector<unsigned_char> *pvVar10;
  uint actual_size;
  int iVar11;
  uint32 uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 in_R10D;
  uint zslice;
  int iVar15;
  uint actual_size_5;
  ulong uVar16;
  uint face;
  int iVar17;
  uint32 image_size;
  uint32 key_value_size;
  uint8 padding [3];
  uint local_6c;
  elemental_vector local_68;
  undefined2 local_54;
  undefined1 local_52;
  data_stream_serializer *local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  undefined4 local_38;
  int local_34;
  
  local_50 = serializer;
  bVar3 = consistency_check(this);
  if (bVar3) {
    (this->m_header).m_identifier[0] = 0xab;
    (this->m_header).m_identifier[1] = 'K';
    (this->m_header).m_identifier[2] = 'T';
    (this->m_header).m_identifier[3] = 'X';
    (this->m_header).m_identifier[4] = ' ';
    (this->m_header).m_identifier[5] = '1';
    (this->m_header).m_identifier[6] = '1';
    (this->m_header).m_identifier[7] = 0xbb;
    (this->m_header).m_identifier[8] = '\r';
    (this->m_header).m_identifier[9] = '\n';
    (this->m_header).m_identifier[10] = '\x1a';
    (this->m_header).m_identifier[0xb] = '\n';
    bVar3 = this->m_opposite_endianness;
    uVar12 = 0x4030201;
    if (bVar3 != false) {
      uVar12 = 0x1020304;
    }
    (this->m_header).m_endianness = uVar12;
    if (this->m_block_dim == 1) {
      uVar4 = get_ogl_type_size((this->m_header).m_glType);
      (this->m_header).m_glTypeSize = uVar4;
      uVar12 = (this->m_header).m_glFormat;
    }
    else {
      uVar12 = get_ogl_base_internal_fmt((this->m_header).m_glInternalFormat);
    }
    (this->m_header).m_glBaseInternalFormat = uVar12;
    (this->m_header).m_bytesOfKeyValueData = 0;
    if ((!no_keyvalue_data) && (uVar16 = (ulong)(this->m_key_values).m_size, uVar16 != 0)) {
      pvVar10 = (this->m_key_values).m_p;
      lVar9 = 0;
      uVar12 = 0;
      do {
        uVar12 = uVar12 + (*(int *)((long)&pvVar10->m_size + lVar9) + 3U & 0xfffffffc) + 4;
        (this->m_header).m_bytesOfKeyValueData = uVar12;
        lVar9 = lVar9 + 0x10;
      } while (uVar16 << 4 != lVar9);
    }
    if (bVar3 != false) {
      lVar9 = 3;
      do {
        uVar5 = *(uint *)((this->m_header).m_identifier + lVar9 * 4);
        *(uint *)((this->m_header).m_identifier + lVar9 * 4) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0x10);
    }
    uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])(local_50->m_pStream,this,0x40);
    if (this->m_opposite_endianness == true) {
      lVar9 = 3;
      do {
        uVar6 = *(uint *)((this->m_header).m_identifier + lVar9 * 4);
        *(uint *)((this->m_header).m_identifier + lVar9 * 4) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 0x10);
    }
    if ((uVar5 & 0xffffffc0) == 0x40) {
      local_52 = 0;
      local_54 = 0;
      if ((!no_keyvalue_data) && ((this->m_key_values).m_size != 0)) {
        lVar9 = 0;
        uVar16 = 0;
        do {
          uVar5 = *(uint *)((long)&((this->m_key_values).m_p)->m_size + lVar9);
          if (this->m_opposite_endianness == true) {
            uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          }
          local_68.m_p = (void *)CONCAT44(local_68.m_p._4_4_,uVar5);
          uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])(local_50->m_pStream,&local_68,4);
          if (this->m_opposite_endianness == true) {
            local_68.m_p = (void *)CONCAT44(local_68.m_p._4_4_,
                                            (uint)local_68.m_p >> 0x18 |
                                            ((uint)local_68.m_p & 0xff0000) >> 8 |
                                            ((uint)local_68.m_p & 0xff00) << 8 |
                                            (uint)local_68.m_p << 0x18);
          }
          if ((uVar5 & 0xfffffffc) != 4) {
            return false;
          }
          uVar5 = (uint)local_68.m_p;
          if ((uint)local_68.m_p != 0) {
            uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                              (local_50->m_pStream,
                               *(undefined8 *)((long)&((this->m_key_values).m_p)->m_p + lVar9),
                               (ulong)local_68.m_p & 0xffffffff);
            if ((uVar6 != uVar5) && (uVar6 / uVar5 != 1)) {
              return false;
            }
            uVar5 = (uint)local_68.m_p - 1 & 3;
            if (uVar5 != 3) {
              uVar5 = uVar5 ^ 3;
              uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                                (local_50->m_pStream,&local_54,(ulong)uVar5);
              if ((uVar6 != uVar5) && (uVar6 / uVar5 != 1)) {
                return false;
              }
            }
          }
          uVar16 = uVar16 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar16 < (this->m_key_values).m_size);
      }
      local_40 = 0;
      while( true ) {
        bVar7 = (byte)local_40;
        uVar6 = (this->m_header).m_pixelWidth >> (bVar7 & 0x1f);
        uVar12 = (this->m_header).m_pixelHeight;
        uVar8 = uVar12 + (uVar12 == 0) >> (bVar7 & 0x1f);
        uVar12 = (this->m_header).m_pixelDepth;
        uVar13 = uVar12 + (uVar12 == 0);
        uVar5 = uVar13 >> (bVar7 & 0x1f);
        iVar17 = uVar5 + (uVar5 == 0);
        uVar5 = this->m_block_dim;
        uVar14 = (uVar5 + uVar6 + (uVar6 == 0)) - 1;
        uVar6 = (uVar5 + uVar8 + (uVar8 == 0)) - 1;
        in_R10D = CONCAT31((int3)((uint)in_R10D >> 8),uVar5 <= uVar6 && uVar5 <= uVar14);
        if (uVar5 > uVar6 || uVar5 > uVar14) break;
        local_6c = (uVar14 / uVar5) * (uVar6 / uVar5) * this->m_bytes_per_block;
        uVar12 = (this->m_header).m_numberOfArrayElements;
        uVar2 = (this->m_header).m_numberOfFaces;
        if (uVar2 == 1 || uVar12 != 0) {
          local_6c = local_6c * uVar13 * (uVar12 + (uVar12 == 0)) * uVar2;
        }
        if (local_6c == 0) {
          return false;
        }
        if (this->m_opposite_endianness == true) {
          local_6c = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 | (local_6c & 0xff00) << 8 |
                     local_6c << 0x18;
        }
        local_38 = in_R10D;
        uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])(local_50->m_pStream,&local_6c,4);
        if (this->m_opposite_endianness == true) {
          local_6c = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 | (local_6c & 0xff00) << 8 |
                     local_6c << 0x18;
        }
        if ((uVar5 & 0xfffffffc) != 4) {
          return false;
        }
        uVar5 = (this->m_header).m_numberOfArrayElements;
        uVar6 = (this->m_header).m_numberOfFaces;
        if (uVar6 == 6 && uVar5 == 0) {
          uVar6 = 0;
          uVar5 = 6;
          do {
            uVar12 = (this->m_header).m_pixelDepth;
            uVar2 = (this->m_header).m_numberOfArrayElements;
            uVar8 = (uVar5 * (int)local_40 * (uVar2 + (uVar2 == 0)) + uVar6) *
                    (uVar12 + (uVar12 == 0));
            pvVar10 = (this->m_image_data).m_p;
            uVar5 = pvVar10[uVar8].m_size;
            if (uVar5 == 0) {
              return false;
            }
            if (uVar5 != local_6c) {
              return false;
            }
            pvVar10 = pvVar10 + uVar8;
            if (this->m_opposite_endianness == true) {
              local_68.m_p = (void *)0x0;
              local_68.m_size = 0;
              local_68.m_capacity = 0;
              elemental_vector::increase_capacity
                        (&local_68,pvVar10->m_size,false,1,(object_mover)0x0,false);
              local_68.m_size = pvVar10->m_size;
              memcpy(local_68.m_p,pvVar10->m_p,(ulong)pvVar10->m_size);
              uVar4 = local_68.m_size;
              uVar12 = (this->m_header).m_glTypeSize;
              if (uVar12 == 8) {
                if (7 < local_68.m_size) {
                  lVar9 = 0;
                  do {
                    uVar16 = *(ulong *)((long)local_68.m_p + lVar9 * 8);
                    *(ulong *)((long)local_68.m_p + lVar9 * 8) =
                         uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                         (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                         (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                         (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
                    lVar9 = lVar9 + 1;
                  } while (local_68.m_size >> 3 != (uint)lVar9);
                }
              }
              else if (uVar12 == 4) {
                if (3 < local_68.m_size) {
                  lVar9 = 0;
                  do {
                    uVar5 = *(uint *)((long)local_68.m_p + lVar9 * 4);
                    *(uint *)((long)local_68.m_p + lVar9 * 4) =
                         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                         uVar5 << 0x18;
                    lVar9 = lVar9 + 1;
                  } while (local_68.m_size >> 2 != (uint)lVar9);
                }
              }
              else if ((uVar12 == 2) && (1 < local_68.m_size)) {
                lVar9 = 0;
                do {
                  puVar1 = (ushort *)((long)local_68.m_p + lVar9 * 2);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                  lVar9 = lVar9 + 1;
                } while (local_68.m_size >> 1 != (uint)lVar9);
              }
              if (local_68.m_size == 0) {
                bVar3 = false;
              }
              else {
                uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])
                                  (local_50->m_pStream,local_68.m_p,local_68._8_8_ & 0xffffffff);
                bVar3 = uVar5 == uVar4 || uVar5 / uVar4 == 1;
              }
              if (local_68.m_p != (void *)0x0) {
                crnlib_free(local_68.m_p);
              }
              if (!bVar3) {
                return false;
              }
            }
            else {
              uVar8 = (*local_50->m_pStream->_vptr_data_stream[6])
                                (local_50->m_pStream,pvVar10->m_p,(ulong)uVar5);
              if ((uVar8 != uVar5) && (uVar8 / uVar5 != 1)) {
                return false;
              }
            }
            uVar5 = pvVar10->m_size - 1 & 3;
            if (uVar5 != 3) {
              uVar5 = uVar5 ^ 3;
              uVar8 = (*local_50->m_pStream->_vptr_data_stream[6])
                                (local_50->m_pStream,&local_54,(ulong)uVar5);
              if ((uVar8 != uVar5) && (uVar8 / uVar5 != 1)) {
                return false;
              }
            }
            uVar6 = uVar6 + 1;
            uVar5 = (this->m_header).m_numberOfFaces;
          } while (uVar6 < uVar5);
        }
        else {
          local_44 = 0;
          iVar11 = 0;
          local_34 = iVar17;
          do {
            if (uVar6 == 0) {
              uVar6 = 0;
            }
            else {
              local_48 = 0;
              do {
                iVar15 = 0;
                do {
                  uVar12 = (this->m_header).m_pixelDepth;
                  uVar2 = (this->m_header).m_numberOfArrayElements;
                  uVar6 = (((uVar2 + (uVar2 == 0)) * (int)local_40 + local_44) *
                           (this->m_header).m_numberOfFaces + local_48) * (uVar12 + (uVar12 == 0)) +
                          iVar15;
                  pvVar10 = (this->m_image_data).m_p;
                  uVar5 = pvVar10[uVar6].m_size;
                  if (uVar5 == 0) {
                    return false;
                  }
                  pvVar10 = pvVar10 + uVar6;
                  if (this->m_opposite_endianness == true) {
                    local_68.m_p = (void *)0x0;
                    local_68.m_size = 0;
                    local_68.m_capacity = 0;
                    elemental_vector::increase_capacity
                              (&local_68,pvVar10->m_size,false,1,(object_mover)0x0,false);
                    local_68.m_size = pvVar10->m_size;
                    memcpy(local_68.m_p,pvVar10->m_p,(ulong)pvVar10->m_size);
                    uVar4 = local_68.m_size;
                    uVar12 = (this->m_header).m_glTypeSize;
                    if (uVar12 == 8) {
                      if (7 < local_68.m_size) {
                        lVar9 = 0;
                        do {
                          uVar16 = *(ulong *)((long)local_68.m_p + lVar9 * 8);
                          *(ulong *)((long)local_68.m_p + lVar9 * 8) =
                               uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                               (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                               (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                               (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
                          lVar9 = lVar9 + 1;
                        } while (local_68.m_size >> 3 != (uint)lVar9);
                      }
                    }
                    else if (uVar12 == 4) {
                      if (3 < local_68.m_size) {
                        lVar9 = 0;
                        do {
                          uVar5 = *(uint *)((long)local_68.m_p + lVar9 * 4);
                          *(uint *)((long)local_68.m_p + lVar9 * 4) =
                               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                               uVar5 << 0x18;
                          lVar9 = lVar9 + 1;
                        } while (local_68.m_size >> 2 != (uint)lVar9);
                      }
                    }
                    else if ((uVar12 == 2) && (1 < local_68.m_size)) {
                      lVar9 = 0;
                      do {
                        puVar1 = (ushort *)((long)local_68.m_p + lVar9 * 2);
                        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                        lVar9 = lVar9 + 1;
                      } while (local_68.m_size >> 1 != (uint)lVar9);
                    }
                    if (local_68.m_size == 0) {
                      bVar3 = false;
                    }
                    else {
                      uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])
                                        (local_50->m_pStream,local_68.m_p,
                                         local_68._8_8_ & 0xffffffff);
                      bVar3 = uVar5 == uVar4 || uVar5 / uVar4 == 1;
                    }
                    if (local_68.m_p != (void *)0x0) {
                      crnlib_free(local_68.m_p);
                    }
                    iVar17 = local_34;
                    if (!bVar3) {
                      return false;
                    }
                  }
                  else {
                    uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                                      (local_50->m_pStream,pvVar10->m_p,(ulong)uVar5);
                    if ((uVar6 != uVar5) && (uVar6 / uVar5 != 1)) {
                      return false;
                    }
                  }
                  iVar11 = iVar11 + pvVar10->m_size;
                  iVar15 = iVar15 + 1;
                } while (iVar15 != iVar17);
                local_48 = local_48 + 1;
                uVar6 = (this->m_header).m_numberOfFaces;
              } while (local_48 < uVar6);
              uVar5 = (this->m_header).m_numberOfArrayElements;
            }
            local_44 = local_44 + 1;
          } while (local_44 < uVar5);
          uVar5 = iVar11 - 1U & 3;
          if (uVar5 != 3) {
            uVar5 = uVar5 ^ 3;
            uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                              (local_50->m_pStream,&local_54,(ulong)uVar5);
            if ((uVar6 != uVar5) && (uVar6 / uVar5 != 1)) {
              return false;
            }
          }
        }
        uVar5 = (int)local_40 + 1;
        local_40 = (ulong)uVar5;
        if ((this->m_header).m_numberOfMipmapLevels <= uVar5) {
          return (bool)(undefined1)local_38;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ktx_texture::write_to_stream(data_stream_serializer& serializer, bool no_keyvalue_data) {
  if (!consistency_check()) {
    CRNLIB_ASSERT(0);
    return false;
  }

  memcpy(m_header.m_identifier, s_ktx_file_id, sizeof(m_header.m_identifier));
  m_header.m_endianness = m_opposite_endianness ? KTX_OPPOSITE_ENDIAN : KTX_ENDIAN;

  if (m_block_dim == 1) {
    m_header.m_glTypeSize = get_ogl_type_size(m_header.m_glType);
    m_header.m_glBaseInternalFormat = m_header.m_glFormat;
  } else {
    m_header.m_glBaseInternalFormat = get_ogl_base_internal_fmt(m_header.m_glInternalFormat);
  }

  m_header.m_bytesOfKeyValueData = 0;
  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++)
      m_header.m_bytesOfKeyValueData += sizeof(uint32) + ((m_key_values[i].size() + 3) & ~3);
  }

  if (m_opposite_endianness)
    m_header.endian_swap();

  bool success = (serializer.write(&m_header, sizeof(m_header), 1) == 1);

  if (m_opposite_endianness)
    m_header.endian_swap();

  if (!success)
    return success;

  uint total_key_value_bytes = 0;
  const uint8 padding[3] = {0, 0, 0};

  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++) {
      uint32 key_value_size = m_key_values[i].size();

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      success = (serializer.write(&key_value_size, sizeof(key_value_size), 1) == 1);
      total_key_value_bytes += sizeof(key_value_size);

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      if (!success)
        return false;

      if (key_value_size) {
        if (serializer.write(&m_key_values[i][0], key_value_size, 1) != 1)
          return false;
        total_key_value_bytes += key_value_size;

        uint num_padding = 3 - ((key_value_size + 3) % 4);
        if ((num_padding) && (serializer.write(padding, num_padding, 1) != 1))
          return false;
        total_key_value_bytes += num_padding;
      }
    }
    (void)total_key_value_bytes;
  }

  CRNLIB_ASSERT(total_key_value_bytes == m_header.m_bytesOfKeyValueData);

  for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++) {
    uint mip_width, mip_height, mip_depth;
    get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

    const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
    const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
    if ((!mip_row_blocks) || (!mip_col_blocks))
      return false;

    uint32 image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
    if ((m_header.m_numberOfArrayElements) || (get_num_faces() == 1))
      image_size *= (get_array_size() * get_num_faces() * get_depth());

    if (!image_size)
      return false;

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    success = (serializer.write(&image_size, sizeof(image_size), 1) == 1);

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    if (!success)
      return false;

    uint total_mip_size = 0;

    if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6)) {
      // plain non-array cubemap
      for (uint face = 0; face < get_num_faces(); face++) {
        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, 0, face, 0));
        if ((!image_data.size()) || (image_data.size() != image_size))
          return false;

        if (m_opposite_endianness) {
          uint8_vec tmp_image_data(image_data);
          utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
          if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
            return false;
        } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
          return false;

        uint num_cube_pad_bytes = 3 - ((image_data.size() + 3) % 4);
        if ((num_cube_pad_bytes) && (serializer.write(padding, num_cube_pad_bytes, 1) != 1))
          return false;

        total_mip_size += image_size + num_cube_pad_bytes;
      }
    } else {
      // 1D, 2D, 3D (normal or array texture), or array cubemap
      for (uint array_element = 0; array_element < get_array_size(); array_element++) {
        for (uint face = 0; face < get_num_faces(); face++) {
          for (uint zslice = 0; zslice < mip_depth; zslice++) {
            const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));
            if (!image_data.size())
              return false;

            if (m_opposite_endianness) {
              uint8_vec tmp_image_data(image_data);
              utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
              if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
                return false;
            } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
              return false;

            total_mip_size += image_data.size();
          }
        }
      }

      uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
      if ((num_mip_pad_bytes) && (serializer.write(padding, num_mip_pad_bytes, 1) != 1))
        return false;
      total_mip_size += num_mip_pad_bytes;
    }
    CRNLIB_ASSERT((total_mip_size & 3) == 0);
  }

  return true;
}